

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::IFCImporter::CanRead(IFCImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  char *tokens [1];
  string local_50;
  char *local_30;
  
  BaseImporter::GetExtension(&local_50,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  bVar1 = true;
  if (iVar2 == 0) goto LAB_00508c72;
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 == 0) goto LAB_00508c72;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_00508c41;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_00508c41:
    local_30 = "ISO-10303-21";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_30,1,200,false,false);
    goto LAB_00508c72;
  }
  bVar1 = false;
LAB_00508c72:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool IFCImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "ifc" || extension == "ifczip" ) {
        return true;
    } else if ((!extension.length() || checkSig) && pIOHandler)   {
        // note: this is the common identification for STEP-encoded files, so
        // it is only unambiguous as long as we don't support any further
        // file formats with STEP as their encoding.
        const char* tokens[] = {"ISO-10303-21"};
        const bool found( SearchFileHeaderForToken( pIOHandler, pFile, tokens, 1 ) );
        return found;
    }
    return false;
}